

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  undefined1 auVar1 [16];
  ImVec4 *in_RCX;
  ImVec2 *in_RDX;
  ImVec2 *in_RSI;
  ImDrawList *in_R9;
  byte bVar2;
  float fVar3;
  undefined1 auVar4 [64];
  float *in_stack_00000008;
  ImVec2 *in_stack_00000010;
  ImVec4 fine_clip_rect;
  bool need_clipping;
  ImVec2 *clip_max;
  ImVec2 *clip_min;
  ImVec2 text_size;
  ImVec2 pos;
  float in_stack_ffffffffffffff80;
  undefined3 uVar5;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  ImVec2 *pIVar6;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  ImU32 col;
  float local_40;
  ImVec2 font;
  undefined1 extraout_var [56];
  ImGuiCol idx;
  
  font = *in_RSI;
  if (in_R9 == (ImDrawList *)0x0) {
    auVar4._0_8_ = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),in_stack_ffffffffffffff90,
                                SUB81((ulong)in_stack_ffffffffffffff88 >> 0x38,0),
                                (float)in_stack_ffffffffffffff88);
    auVar4._8_56_ = extraout_var;
    _local_40 = vmovlpd_avx(auVar4._0_16_);
  }
  else {
    local_40 = (float)(in_R9->CmdBuffer).Size;
    unique0x00012004 = (float)(in_R9->CmdBuffer).Capacity;
  }
  pIVar6 = in_RDX;
  if (in_stack_00000010 != (ImVec2 *)0x0) {
    pIVar6 = in_stack_00000010 + 1;
    in_RSI = in_stack_00000010;
  }
  fVar3 = font.x;
  idx = CONCAT13(1,(int3)in_stack_ffffffffffffff84);
  stack0xffffffffffffffc4 = (float)((ulong)_local_40 >> 0x20);
  if (fVar3 + local_40 < pIVar6->x) {
    idx = CONCAT13(pIVar6->y <= font.y + stack0xffffffffffffffc4,(int3)in_stack_ffffffffffffff84);
  }
  bVar2 = (byte)((uint)idx >> 0x18);
  if (in_stack_00000010 != (ImVec2 *)0x0) {
    uVar5 = CONCAT12(1,(short)idx);
    if (in_RSI->x <= fVar3) {
      uVar5 = CONCAT12(font.y < in_RSI->y,(short)idx);
    }
    idx = CONCAT13(bVar2,uVar5);
    bVar2 = (bool)bVar2 != false || (char)((uint3)uVar5 >> 0x10) != '\0';
  }
  if (0.0 < *in_stack_00000008) {
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)*in_stack_00000008),
                             ZEXT416((uint)((in_RDX->x - fVar3) - local_40)),ZEXT416((uint)fVar3));
    fVar3 = ImMax<float>(fVar3,auVar1._0_4_);
    font.x = fVar3;
  }
  if (0.0 < in_stack_00000008[1]) {
    fVar3 = font.y;
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_00000008[1]),
                             ZEXT416((uint)((in_RDX->y - fVar3) - stack0xffffffffffffffc4)),
                             ZEXT416((uint)fVar3));
    fVar3 = ImMax<float>(fVar3,auVar1._0_4_);
    font.y = fVar3;
  }
  if ((bVar2 & 1) == 0) {
    GetColorU32(idx,in_stack_ffffffffffffff80);
    ImDrawList::AddText(in_R9,(ImFont *)font,stack0xffffffffffffffc4,in_RSI,
                        (ImU32)((ulong)pIVar6 >> 0x20),
                        (char *)CONCAT17(bVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff9c,in_RCX);
  }
  else {
    ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff9c,in_RSI->x,in_RSI->y,pIVar6->x,pIVar6->y);
    col = (ImU32)((ulong)pIVar6 >> 0x20);
    GetColorU32(idx,in_stack_ffffffffffffff80);
    ImDrawList::AddText(in_R9,(ImFont *)font,stack0xffffffffffffffc4,in_RSI,col,
                        (char *)CONCAT17(bVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff9c,in_RCX);
  }
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}